

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  pointer puVar1;
  App *pAVar2;
  pointer pcVar3;
  pointer psVar4;
  App *pAVar5;
  ConfigBase *pCVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  ostream *poVar11;
  pointer pbVar12;
  long lVar13;
  pointer psVar14;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  _Var15;
  size_t sVar16;
  App *pAVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  undefined8 *puVar19;
  long *plVar20;
  undefined7 in_register_00000009;
  char *pcVar21;
  long *plVar22;
  ulong *puVar23;
  size_type *psVar24;
  size_type sVar25;
  pointer pbVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar27;
  pointer ppAVar28;
  pointer ppAVar29;
  _Alloc_hider _Var30;
  undefined8 uVar31;
  undefined7 in_register_00000081;
  App **ppAVar32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *test_name;
  Option_p *opt;
  pointer puVar33;
  string *psVar34;
  bool bVar35;
  string single_name;
  string name;
  string value;
  string commentLead;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  string keyChars;
  string commentTest;
  stringstream out;
  value_type local_448;
  string local_428;
  string local_408;
  ConfigBase *local_3e8;
  uint local_3e0;
  uint local_3dc;
  uint local_3d8;
  uint local_3d4;
  string local_3d0;
  string local_3b0;
  string *local_388;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_380;
  undefined1 local_368 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  App *local_328;
  App **local_320;
  string local_318;
  undefined1 *local_2f0;
  long local_2e8;
  undefined1 local_2e0 [24];
  string *local_2c8;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  _Any_data local_278;
  code *local_268;
  undefined8 uStack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248 [3];
  string local_218;
  string local_1f8;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_3dc = (uint)CONCAT71(in_register_00000081,write_description);
  local_3d4 = (uint)CONCAT71(in_register_00000009,default_also);
  local_388 = prefix;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::push_back((char)&local_3b0);
  ::std::__cxx11::string::push_back((char)&local_3b0);
  local_2f0 = local_2e0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"#;","");
  ::std::__cxx11::string::push_back((char)&local_2f0);
  ::std::__cxx11::string::push_back((char)&local_2f0);
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_318,local_2f0,local_2f0 + local_2e8);
  local_2c8 = __return_storage_ptr__;
  ::std::__cxx11::string::push_back((char)&local_318);
  ::std::__cxx11::string::push_back((char)&local_318);
  ::std::__cxx11::string::push_back((char)&local_318);
  ::std::__cxx11::string::push_back((char)&local_318);
  ::std::__cxx11::string::push_back((char)&local_318);
  ::std::__cxx11::string::push_back((char)&local_318);
  local_348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar33 = (app->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (app->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar33 != puVar1) {
    do {
      _Var10 = ::std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (local_348.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          local_348.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (puVar33->_M_t).
                          super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
                          .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                          super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      if (_Var10._M_current ==
          local_348.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_348,
                    (value_type *)
                    (puVar33->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      }
      puVar33 = puVar33 + 1;
    } while (puVar33 != puVar1);
  }
  pbVar26 = local_348.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"options","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&local_348,(const_iterator)pbVar26,&local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  local_3e8 = this;
  local_328 = app;
  if (local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_280 = local_348.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pbVar26 = local_348.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar27 = local_348.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar8 = 0;
    do {
      iVar9 = ::std::__cxx11::string::compare((char *)pbVar26);
      if (iVar9 == 0) {
        bVar7 = 1;
        if ((bVar8 & 1) == 0) goto LAB_0010e242;
      }
      else {
        bVar35 = pbVar26->_M_string_length == 0;
        bVar7 = 1;
        if ((bVar35 & bVar8) == 0) {
          bVar7 = bVar35 | bVar8;
LAB_0010e242:
          local_3e0 = CONCAT31(local_3e0._1_3_,bVar7);
          if ((((char)local_3dc != '\0') &&
              (iVar9 = ::std::__cxx11::string::compare((char *)pbVar26), iVar9 != 0)) &&
             (pbVar26->_M_string_length != 0)) {
            local_448._M_dataplus._M_p._0_1_ = 10;
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)&local_448,1);
            local_448._M_dataplus._M_p._0_1_ = this->commentChar;
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)&local_448,1);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(pbVar26->_M_dataplus)._M_p,pbVar26->_M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," Options\n",9);
          }
          local_278._M_unused._M_object = (void *)0x0;
          local_278._8_8_ = 0;
          local_268 = (code *)0x0;
          uStack_260 = 0;
          App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                           local_368,app,(function<bool_(const_CLI::Option_*)> *)&local_278);
          if (local_268 != (code *)0x0) {
            (*local_268)(&local_278,&local_278,__destroy_functor);
          }
          local_320 = (App **)local_368._8_8_;
          ppAVar32 = (App **)local_368._0_8_;
          if (local_368._0_8_ != local_368._8_8_) {
            do {
              pAVar2 = *ppAVar32;
              if (((pAVar2->name_).field_2._M_local_buf[0xb] == '\x01') &&
                 (((pcVar3 = (pAVar2->name_)._M_dataplus._M_p,
                   pcVar3 == (pointer)pbVar26->_M_string_length &&
                   ((pcVar3 == (pointer)0x0 ||
                    (iVar9 = bcmp((((OptionBase<CLI::Option> *)&pAVar2->_vptr_App)->group_).
                                  _M_dataplus._M_p,(pbVar26->_M_dataplus)._M_p,(size_t)pcVar3),
                    iVar9 == 0)))) ||
                  ((iVar9 = ::std::__cxx11::string::compare((char *)pbVar26), iVar9 == 0 &&
                   ((pAVar2->name_)._M_dataplus._M_p == (pointer)0x0)))))) {
                pbVar12 = *(pointer *)((long)&(pAVar2->description_).field_2 + 8);
                if ((pbVar12 == *(pointer *)&pAVar2->allow_extras_) &&
                   (pbVar12 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&(pAVar2->description_)._M_dataplus)->_M_impl).
                              super__Vector_impl_data._M_start,
                   pbVar12 == (pointer)(pAVar2->description_)._M_string_length)) {
                  pbVar12 = (pointer)&(&pAVar2->parse_complete_callback_)
                                      [*(size_type *)
                                        &(pAVar2->final_callback_).super__Function_base._M_functor
                                       == 0]._M_invoker;
                }
                local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
                pcVar3 = (pbVar12->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_448,pcVar3,pcVar3 + pbVar12->_M_string_length);
                if (local_448._M_string_length == 0) {
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_448._M_dataplus._M_p != &local_448.field_2) goto LAB_0010e876;
                }
                else {
                  Option::reduced_results_abi_cxx11_((results_t *)&local_380,(Option *)pAVar2);
                  detail::ini_join(&local_408,
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_380,this->arraySeparator,this->arrayStart,
                                   this->arrayEnd,this->stringQuote,this->literalQuote);
                  bVar8 = (char *)local_408._M_string_length == (char *)0x0 & (byte)local_3d4;
                  local_3d8 = CONCAT31(local_3d8._1_3_,bVar8);
                  if (bVar8 == 1) {
                    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_428,
                               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&pAVar2->options_)[1]._M_allocated_capacity,
                               (pAVar2->usage_)._M_dataplus._M_p +
                               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&pAVar2->options_)[1]._M_allocated_capacity);
                    sVar25 = local_428._M_string_length;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_428._M_dataplus._M_p != &local_428.field_2) {
                      operator_delete(local_428._M_dataplus._M_p);
                    }
                    if (sVar25 == 0) {
                      if (*(int *)&pAVar2->help_ptr_ == 0) {
                        pcVar21 = "false";
                      }
                      else {
                        pcVar21 = "\"\"";
                        if ((*(char *)((long)&(pAVar2->exclude_options_)._M_t._M_impl.
                                              super__Rb_tree_header._M_header._M_left + 3) == '\0')
                           && (pcVar21 = "\"\"", (pAVar2->name_).field_2._M_local_buf[8] != '\0')) {
                          pcVar21 = "\"<REQUIRED>\"";
                        }
                      }
                      ::std::__cxx11::string::_M_replace
                                ((ulong)&local_408,0,(char *)local_408._M_string_length,
                                 (ulong)pcVar21);
                      this = local_3e8;
                    }
                    else {
                      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_3d0,
                                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)&pAVar2->options_)[1]._M_allocated_capacity,
                                 (pAVar2->usage_)._M_dataplus._M_p +
                                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)&pAVar2->options_)[1]._M_allocated_capacity);
                      detail::convert_arg_for_ini
                                (&local_428,&local_3d0,local_3e8->stringQuote,
                                 local_3e8->literalQuote,false);
                      ::std::__cxx11::string::operator=((string *)&local_408,(string *)&local_428);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_dataplus._M_p != &local_428.field_2) {
                        operator_delete(local_428._M_dataplus._M_p);
                      }
                      this = local_3e8;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                        operator_delete(local_3d0._M_dataplus._M_p);
                        this = local_3e8;
                      }
                    }
                  }
                  if ((char *)local_408._M_string_length != (char *)0x0) {
                    if (*(pointer *)
                         &(pAVar2->parse_complete_callback_).super__Function_base._M_functor !=
                        *(pointer *)
                         ((long)&(pAVar2->parse_complete_callback_).super__Function_base._M_functor
                         + 8)) {
                      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_218,local_408._M_dataplus._M_p,
                                 (char *)(local_408._M_string_length +
                                         (long)local_408._M_dataplus._M_p));
                      Option::get_flag_value(&local_428,(Option *)pAVar2,&local_448,&local_218);
                      ::std::__cxx11::string::operator=((string *)&local_408,(string *)&local_428);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_dataplus._M_p != &local_428.field_2) {
                        operator_delete(local_428._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_218._M_dataplus._M_p != &local_218.field_2) {
                        operator_delete(local_218._M_dataplus._M_p);
                      }
                    }
                    if (((char)local_3dc != '\0') &&
                       (lVar13._0_1_ = (pAVar2->option_defaults_).
                                       super_OptionBase<CLI::OptionDefaults>.required_,
                       lVar13._1_1_ = (pAVar2->option_defaults_).
                                      super_OptionBase<CLI::OptionDefaults>.ignore_case_,
                       lVar13._2_1_ = (pAVar2->option_defaults_).
                                      super_OptionBase<CLI::OptionDefaults>.ignore_underscore_,
                       lVar13._3_1_ = (pAVar2->option_defaults_).
                                      super_OptionBase<CLI::OptionDefaults>.configurable_,
                       lVar13._4_1_ = (pAVar2->option_defaults_).
                                      super_OptionBase<CLI::OptionDefaults>.disable_flag_override_,
                       lVar13._5_1_ = (pAVar2->option_defaults_).
                                      super_OptionBase<CLI::OptionDefaults>.delimiter_,
                       lVar13._6_1_ = (pAVar2->option_defaults_).
                                      super_OptionBase<CLI::OptionDefaults>.always_capture_default_,
                       lVar13._7_1_ = (pAVar2->option_defaults_).
                                      super_OptionBase<CLI::OptionDefaults>.multi_option_policy_,
                       lVar13 != 0)) {
                      lVar13 = ::std::ostream::tellp();
                      if (lVar13 != 0) {
                        local_428._M_dataplus._M_p._0_1_ = 10;
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,(char *)&local_428,1);
                      }
                      poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          (local_1a8,local_3b0._M_dataplus._M_p,
                                           local_3b0._M_string_length);
                      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                      lVar13 = *(long *)((long)&(pAVar2->option_defaults_).
                                                super_OptionBase<CLI::OptionDefaults>.group_.field_2
                                        + 8);
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_2a0,lVar13,
                                 *(long *)&(pAVar2->option_defaults_).
                                           super_OptionBase<CLI::OptionDefaults>.required_ + lVar13)
                      ;
                      detail::fix_newlines(&local_428,&local_3b0,&local_2a0);
                      poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar11,local_428._M_dataplus._M_p,
                                           local_428._M_string_length);
                      local_3d0._M_dataplus._M_p._0_1_ = 10;
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)&local_3d0,1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_dataplus._M_p != &local_428.field_2) {
                        operator_delete(local_428._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                        operator_delete(local_2a0._M_dataplus._M_p);
                      }
                    }
                    clean_name_string(&local_448,&local_318);
                    ::std::operator+(&local_428,local_388,&local_448);
                    this = local_3e8;
                    if (((byte)local_3d8 & local_3e8->commentDefaultsBool) == 1) {
                      ::std::operator+(&local_3d0,local_3e8->commentChar,&local_428);
                      ::std::__cxx11::string::operator=((string *)&local_428,(string *)&local_3d0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                        operator_delete(local_3d0._M_dataplus._M_p);
                      }
                    }
                    poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,local_428._M_dataplus._M_p,
                                         local_428._M_string_length);
                    local_3d0._M_dataplus._M_p._0_1_ = this->valueDelimiter;
                    poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar11,(char *)&local_3d0,1);
                    poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar11,local_408._M_dataplus._M_p,
                                         local_408._M_string_length);
                    local_3d0._M_dataplus._M_p._0_1_ = 10;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(char *)&local_3d0,1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_428._M_dataplus._M_p != &local_428.field_2) {
                      operator_delete(local_428._M_dataplus._M_p);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_408._M_dataplus._M_p != &local_408.field_2) {
                    operator_delete(local_408._M_dataplus._M_p);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_380);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_448._M_dataplus._M_p != &local_448.field_2) {
LAB_0010e876:
                    operator_delete(local_448._M_dataplus._M_p);
                  }
                }
              }
              ppAVar32 = ppAVar32 + 1;
            } while (ppAVar32 != local_320);
          }
          if ((App **)local_368._0_8_ != (App **)0x0) {
            operator_delete((void *)local_368._0_8_);
          }
          pbVar27 = local_280;
          app = local_328;
          bVar7 = (byte)local_3e0;
        }
      }
      pbVar26 = pbVar26 + 1;
      bVar8 = bVar7;
    } while (pbVar26 != pbVar27);
  }
  local_448.field_2._M_allocated_capacity = 0;
  local_448.field_2._8_8_ = 0;
  local_448._M_dataplus._M_p = (pointer)0x0;
  local_448._M_string_length = 0;
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
            (&local_380,
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_408);
  psVar4 = (app->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppAVar32 = local_380.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  for (psVar14 = (app->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar14 != psVar4; psVar14 = psVar14 + 1
      ) {
    *ppAVar32 = (psVar14->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ppAVar32 = ppAVar32 + 1;
  }
  if ((code *)local_448.field_2._M_allocated_capacity != (code *)0x0) {
    _Var15 = ::std::
             __remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>>
                       ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                         )local_380.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                        (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                         )local_380.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish,
                        (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_app_CLI11_hpp:8806:39)>
                         )&local_448);
    if (_Var15._M_current !=
        local_380.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_380.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)_Var15;
    }
    if ((code *)local_448.field_2._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_448.field_2._M_allocated_capacity)(&local_448,&local_448,3);
    }
  }
  ppAVar29 = local_380.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (local_380.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_380.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_3d8 = local_3d4 & 0xff;
    local_3e0 = local_3dc & 0xff;
    ppAVar28 = local_380.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar2 = *ppAVar28;
      if (((pAVar2->name_)._M_string_length == 0) &&
         (((byte)local_3d4 != '\0' || (sVar16 = App::count_all(pAVar2), sVar16 != 0)))) {
        if (((char)local_3dc != '\0') && ((pAVar2->group_)._M_string_length != 0)) {
          local_448._M_dataplus._M_p._0_1_ = 10;
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)&local_448,1);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(pAVar2->group_)._M_dataplus._M_p,
                               (pAVar2->group_)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," Options\n",9);
        }
        pcVar3 = (local_388->_M_dataplus)._M_p;
        local_1d8[0] = local_1c8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar3,pcVar3 + local_388->_M_string_length);
        (**(local_3e8->super_Config)._vptr_Config)
                  (&local_448,local_3e8,pAVar2,(ulong)local_3d8,(ulong)local_3e0,(string *)local_1d8
                  );
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_448._M_dataplus._M_p,local_448._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p);
        }
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0]);
        }
      }
      ppAVar28 = ppAVar28 + 1;
    } while (ppAVar28 != ppAVar29);
    local_320 = local_380.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    app = local_328;
    if (local_380.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_380.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppAVar29 = local_380.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      do {
        pAVar2 = *ppAVar29;
        sVar25 = (pAVar2->name_)._M_string_length;
        if (sVar25 != 0) {
          if ((byte)local_3d4 == '\0') {
            sVar16 = App::count_all(pAVar2);
            if (sVar16 == 0) goto LAB_0010ef9e;
            sVar25 = (pAVar2->name_)._M_string_length;
          }
          local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
          pcVar3 = (pAVar2->name_)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>((string *)&local_448,pcVar3,pcVar3 + sVar25);
          clean_name_string(&local_448,&local_318);
          if ((pAVar2->configurable_ == true) &&
             (((byte)local_3d4 != '\0' ||
              (pAVar17 = App::get_subcommand(app,pAVar2), pAVar17->parsed_ != 0)))) {
            if ((local_388->_M_string_length == 0) && (app->parent_ != (App *)0x0)) {
              pcVar3 = (app->name_)._M_dataplus._M_p;
              local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_408,pcVar3,pcVar3 + (app->name_)._M_string_length);
              clean_name_string(&local_408,&local_318);
              local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3d0,local_408._M_dataplus._M_p,
                         (char *)(local_408._M_string_length + (long)local_408._M_dataplus._M_p));
              ::std::__cxx11::string::_M_replace_aux
                        ((ulong)&local_3d0,local_3d0._M_string_length,0,'\x01');
              plVar20 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_3d0,(ulong)local_448._M_dataplus._M_p);
              puVar23 = (ulong *)(plVar20 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar20 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_428.field_2._M_allocated_capacity = *puVar23;
                local_428.field_2._8_8_ = plVar20[3];
                local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
              }
              else {
                local_428.field_2._M_allocated_capacity = *puVar23;
                local_428._M_dataplus._M_p = (pointer)*plVar20;
              }
              local_428._M_string_length = plVar20[1];
              *plVar20 = (long)puVar23;
              plVar20[1] = 0;
              *(undefined1 *)(plVar20 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)&local_448,(string *)&local_428);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_428._M_dataplus._M_p != &local_428.field_2) {
                operator_delete(local_428._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                operator_delete(local_3d0._M_dataplus._M_p);
              }
              pAVar17 = app->parent_;
              pAVar5 = pAVar17->parent_;
              while (pAVar5 != (App *)0x0) {
                local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                pcVar3 = (pAVar17->name_)._M_dataplus._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_428,pcVar3,pcVar3 + (pAVar17->name_)._M_string_length);
                clean_name_string(&local_428,&local_318);
                local_368._0_8_ = local_368 + 0x10;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_368,local_428._M_dataplus._M_p,
                           local_428._M_dataplus._M_p + local_428._M_string_length);
                ::std::__cxx11::string::_M_replace_aux((ulong)local_368,local_368._8_8_,0,'\x01');
                plVar20 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)local_368,(ulong)local_448._M_dataplus._M_p);
                puVar23 = (ulong *)(plVar20 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar20 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar23) {
                  local_3d0.field_2._M_allocated_capacity = *puVar23;
                  local_3d0.field_2._8_8_ = plVar20[3];
                  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
                }
                else {
                  local_3d0.field_2._M_allocated_capacity = *puVar23;
                  local_3d0._M_dataplus._M_p = (pointer)*plVar20;
                }
                local_3d0._M_string_length = plVar20[1];
                *plVar20 = (long)puVar23;
                plVar20[1] = 0;
                *(undefined1 *)(plVar20 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)&local_448,(string *)&local_3d0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                  operator_delete(local_3d0._M_dataplus._M_p);
                }
                if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
                  operator_delete((void *)local_368._0_8_);
                }
                pAVar17 = pAVar17->parent_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_428._M_dataplus._M_p != &local_428.field_2) {
                  operator_delete(local_428._M_dataplus._M_p);
                }
                pAVar5 = pAVar17->parent_;
              }
              local_428._M_dataplus._M_p._1_7_ =
                   (undefined7)((ulong)local_428._M_dataplus._M_p >> 8);
              local_428._M_dataplus._M_p._0_1_ = 0x5b;
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,(char *)&local_428,1);
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,local_448._M_dataplus._M_p,local_448._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]\n",2);
              app = local_328;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_408._M_dataplus._M_p != &local_408.field_2) {
                operator_delete(local_408._M_dataplus._M_p);
              }
            }
            else {
              local_408._M_dataplus._M_p._0_1_ = 0x5b;
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,(char *)&local_408,1);
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(local_388->_M_dataplus)._M_p,local_388->_M_string_length
                                  );
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,local_448._M_dataplus._M_p,local_448._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]\n",2);
            }
            local_258[0] = local_248;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
            (**(local_3e8->super_Config)._vptr_Config)
                      (&local_408,local_3e8,pAVar2,(ulong)local_3d8,(ulong)local_3e0,
                       (string *)local_258);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_408._M_dataplus._M_p,local_408._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p);
            }
            paVar18 = local_248;
            _Var30._M_p = (pointer)local_258[0];
          }
          else {
            ::std::operator+(&local_428,local_388,&local_448);
            plVar20 = (long *)::std::__cxx11::string::_M_replace_aux
                                        ((ulong)&local_428,local_428._M_string_length,0,'\x01');
            local_2c0 = &local_2b0;
            plVar22 = plVar20 + 2;
            if ((long *)*plVar20 == plVar22) {
              local_2b0 = *plVar22;
              uStack_2a8 = (undefined4)plVar20[3];
              uStack_2a4 = *(undefined4 *)((long)plVar20 + 0x1c);
            }
            else {
              local_2b0 = *plVar22;
              local_2c0 = (long *)*plVar20;
            }
            local_2b8 = plVar20[1];
            *plVar20 = (long)plVar22;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            (**(local_3e8->super_Config)._vptr_Config)
                      (&local_408,local_3e8,pAVar2,(ulong)local_3d8,(ulong)local_3e0,&local_2c0);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_408._M_dataplus._M_p,local_408._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p);
            }
            if (local_2c0 != &local_2b0) {
              operator_delete(local_2c0);
            }
            paVar18 = &local_428.field_2;
            _Var30._M_p = local_428._M_dataplus._M_p;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var30._M_p != paVar18) {
            operator_delete(_Var30._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_448._M_dataplus._M_p != &local_448.field_2) {
            operator_delete(local_448._M_dataplus._M_p);
          }
        }
LAB_0010ef9e:
        ppAVar29 = ppAVar29 + 1;
      } while (ppAVar29 != local_320);
    }
  }
  pCVar6 = local_3e8;
  if ((char)local_3dc != '\0') {
    ::std::__cxx11::stringbuf::str();
    sVar25 = local_448._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p);
    }
    if (sVar25 != 0) {
      ::std::operator+(&local_428,pCVar6->commentChar,&local_3b0);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_368,pCVar6->commentChar,&local_3b0);
      pcVar3 = (app->description_)._M_dataplus._M_p;
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,pcVar3,pcVar3 + (app->description_)._M_string_length);
      detail::fix_newlines(&local_3d0,(string *)local_368,&local_1f8);
      uVar31 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        uVar31 = local_428.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar31 < local_3d0._M_string_length + local_428._M_string_length) {
        uVar31 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          uVar31 = local_3d0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar31 < local_3d0._M_string_length + local_428._M_string_length)
        goto LAB_0010f3c2;
        puVar19 = (undefined8 *)
                  ::std::__cxx11::string::replace
                            ((ulong)&local_3d0,0,(char *)0x0,(ulong)local_428._M_dataplus._M_p);
      }
      else {
LAB_0010f3c2:
        puVar19 = (undefined8 *)
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_428,(ulong)local_3d0._M_dataplus._M_p);
      }
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      psVar24 = puVar19 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar24) {
        local_408.field_2._M_allocated_capacity = *psVar24;
        local_408.field_2._8_8_ = puVar19[3];
      }
      else {
        local_408.field_2._M_allocated_capacity = *psVar24;
        local_408._M_dataplus._M_p = (pointer)*puVar19;
      }
      local_408._M_string_length = puVar19[1];
      *puVar19 = psVar24;
      puVar19[1] = 0;
      *(undefined1 *)psVar24 = 0;
      plVar20 = (long *)::std::__cxx11::string::_M_replace_aux
                                  ((ulong)&local_408,local_408._M_string_length,0,'\x01');
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      plVar22 = plVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar22) {
        local_448.field_2._M_allocated_capacity = *plVar22;
        local_448.field_2._8_8_ = plVar20[3];
      }
      else {
        local_448.field_2._M_allocated_capacity = *plVar22;
        local_448._M_dataplus._M_p = (pointer)*plVar20;
      }
      local_448._M_string_length = plVar20[1];
      *plVar20 = (long)plVar22;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
        operator_delete((void *)local_368._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p);
      }
      ::std::__cxx11::stringbuf::str();
      psVar34 = local_2c8;
      plVar20 = (long *)::std::__cxx11::string::replace
                                  ((ulong)&local_408,0,(char *)0x0,(ulong)local_448._M_dataplus._M_p
                                  );
      (psVar34->_M_dataplus)._M_p = (pointer)&psVar34->field_2;
      psVar24 = (size_type *)(plVar20 + 2);
      if ((size_type *)*plVar20 == psVar24) {
        lVar13 = plVar20[3];
        (psVar34->field_2)._M_allocated_capacity = *psVar24;
        *(long *)((long)&psVar34->field_2 + 8) = lVar13;
      }
      else {
        (psVar34->_M_dataplus)._M_p = (pointer)*plVar20;
        (psVar34->field_2)._M_allocated_capacity = *psVar24;
      }
      psVar34->_M_string_length = plVar20[1];
      *plVar20 = (long)psVar24;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p);
      }
      goto LAB_0010f5a4;
    }
  }
  psVar34 = local_2c8;
  ::std::__cxx11::stringbuf::str();
LAB_0010f5a4:
  if (local_380.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (App **)0x0) {
    operator_delete(local_380.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar34;
}

Assistant:

CLI11_INLINE std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::string commentTest = "#;";
    commentTest.push_back(commentChar);
    commentTest.push_back(parentSeparatorChar);

    std::string keyChars = commentTest;
    keyChars.push_back(literalQuote);
    keyChars.push_back(stringQuote);
    keyChars.push_back(arrayStart);
    keyChars.push_back(arrayEnd);
    keyChars.push_back(valueDelimiter);
    keyChars.push_back(arraySeparator);

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("options"));

    for(auto &group : groups) {
        if(group == "options" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "options" && !group.empty()) {
            out << '\n' << commentChar << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {
            // Only process options that are configurable
            if(opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "options" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string single_name = opt->get_single_name();
                if(single_name.empty()) {
                    continue;
                }

                auto results = opt->reduced_results();
                std::string value =
                    detail::ini_join(results, arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);

                bool isDefault = false;
                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str(), stringQuote, literalQuote, false);
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    } else if(opt->get_run_callback_for_default() || !opt->get_required()) {
                        value = "\"\"";  // empty string default value
                    } else {
                        value = "\"<REQUIRED>\"";
                    }
                    isDefault = true;
                }

                if(!value.empty()) {
                    if(!opt->get_fnames().empty()) {
                        try {
                            value = opt->get_flag_value(single_name, value);
                        } catch(const CLI::ArgumentMismatch &) {
                            bool valid{false};
                            for(const auto &test_name : opt->get_fnames()) {
                                try {
                                    value = opt->get_flag_value(test_name, value);
                                    single_name = test_name;
                                    valid = true;
                                } catch(const CLI::ArgumentMismatch &) {
                                    continue;
                                }
                            }
                            if(!valid) {
                                value = detail::ini_join(
                                    opt->results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                            }
                        }
                    }
                    if(write_description && opt->has_description()) {
                        if(out.tellp() != std::streampos(0)) {
                            out << '\n';
                        }
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    clean_name_string(single_name, keyChars);

                    std::string name = prefix + single_name;
                    if(commentDefaultsBool && isDefault) {
                        name = commentChar + name;
                    }
                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }

    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            /*if (!prefix.empty() || app->get_parent() == nullptr) {
                out << '[' << prefix << "___"<< subcom->get_group() << "]\n";
            } else {
                std::string subname = app->get_name() + parentSeparatorChar + "___"+subcom->get_group();
                const auto *p = app->get_parent();
                while(p->get_parent() != nullptr) {
                    subname = p->get_name() + parentSeparatorChar +subname;
                    p = p->get_parent();
                }
                out << '[' << subname << "]\n";
            }
            */
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            std::string subname = subcom->get_name();
            clean_name_string(subname, keyChars);

            if(subcom->get_configurable() && (default_also || app->got_subcommand(subcom))) {
                if(!prefix.empty() || app->get_parent() == nullptr) {

                    out << '[' << prefix << subname << "]\n";
                } else {
                    std::string appname = app->get_name();
                    clean_name_string(appname, keyChars);
                    subname = appname + parentSeparatorChar + subname;
                    const auto *p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        std::string pname = p->get_name();
                        clean_name_string(pname, keyChars);
                        subname = pname + parentSeparatorChar + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subname + parentSeparatorChar);
            }
        }
    }

    if(write_description && !out.str().empty()) {
        std::string outString =
            commentChar + commentLead + detail::fix_newlines(commentChar + commentLead, app->get_description()) + '\n';
        return outString + out.str();
    }
    return out.str();
}